

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O3

void __thiscall
CLIntercept::getMDAPICountersFromEvent(CLIntercept *this,string *name,cl_event event)

{
  IMetricSetLatest *pIVar1;
  cl_int e;
  uint32_t numResults;
  long lVar2;
  char *pReportData;
  ulong uVar3;
  float __x;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  results;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  ioInfoValues;
  cl_command_type type;
  size_t outputSize;
  string local_98;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  local_78;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  local_58;
  size_t local_38;
  
  if (this->m_pMDHelper == (MDHelper *)0x0) {
    return;
  }
  pIVar1 = this->m_pMDHelper->m_MetricSet;
  if (pIVar1 == (IMetricSetLatest *)0x0) {
    uVar3 = 0;
  }
  else {
    lVar2 = (**(code **)(*(long *)pIVar1 + 0x10))();
    uVar3 = (ulong)*(uint *)(lVar2 + 0x1c);
  }
  pReportData = (char *)operator_new__(uVar3);
  local_38 = 0;
  e = (*(this->m_Dispatch).clGetEventProfilingInfo)(event,0x407f,uVar3,pReportData,&local_38);
  if (e == 0) {
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    local_58.
    super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    numResults = MetricsDiscovery::MDHelper::GetMetricsFromReports
                           (this->m_pMDHelper,1,pReportData,
                            (vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                             *)&local_98,&local_58);
    if (numResults != 0) {
      MetricsDiscovery::MDHelper::PrintMetricValues
                (this->m_pMDHelper,(ostream *)&this->m_MetricDump,name,numResults,
                 (vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                  *)&local_98,&local_58,&local_78);
      MetricsDiscovery::MDHelper::AggregateMetrics
                (this->m_pMDHelper,&this->m_MetricAggregations,name,
                 (vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                  *)&local_98);
      if (local_78.
          super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_58.
        super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98._M_dataplus._M_p == (pointer)0x0) goto LAB_0019a157;
  }
  else {
    local_58.
    super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_58.
                          super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    (*(this->m_Dispatch).clGetEventInfo)(event,0x11d1,4,&local_58,(size_t *)0x0);
    if ((int)local_58.
             super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
             ._M_impl.super__Vector_impl_data._M_start != 0x11f0) goto LAB_0019a157;
    CEnumNameMap::name_abi_cxx11_(&local_98,&this->m_EnumNameMap,e);
    logf(this,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0019a157;
  }
  operator_delete(local_98._M_dataplus._M_p);
LAB_0019a157:
  operator_delete__(pReportData);
  return;
}

Assistant:

void CLIntercept::getMDAPICountersFromEvent(
    const std::string& name,
    const cl_event event )
{
    // We should only get here when event based sampling is enabled.
    CLI_ASSERT( config().DevicePerfCounterEventBasedSampling );

    if( m_pMDHelper )
    {
        const size_t reportSize = m_pMDHelper->GetQueryReportSize();

        char*   pReport = new char[ reportSize ];
        if( pReport )
        {
            size_t  outputSize = 0;
            cl_int  errorCode = dispatch().clGetEventProfilingInfo(
                event,
                CL_PROFILING_COMMAND_PERFCOUNTERS_INTEL,
                reportSize,
                pReport,
                &outputSize );

            if( errorCode == CL_SUCCESS )
            {
                // Check: The size of the queried report should be the expected size.
                CLI_ASSERT( outputSize == reportSize );

                std::vector<MetricsDiscovery::TTypedValue_1_0> results;
                std::vector<MetricsDiscovery::TTypedValue_1_0> maxValues;
                std::vector<MetricsDiscovery::TTypedValue_1_0> ioInfoValues; // unused

                uint32_t numResults = m_pMDHelper->GetMetricsFromReports(
                    1,
                    pReport,
                    results,
                    maxValues );

                if( numResults )
                {
                    m_pMDHelper->PrintMetricValues(
                        m_MetricDump,
                        name,
                        numResults,
                        results,
                        maxValues,
                        ioInfoValues );
                    m_pMDHelper->AggregateMetrics(
                        m_MetricAggregations,
                        name,
                        results );
                }
            }
            else
            {
                // Currently, MDAPI data is only included for kernels, so only
                // report an errors for kernel events.
                cl_command_type type = 0;
                dispatch().clGetEventInfo(
                    event,
                    CL_EVENT_COMMAND_TYPE,
                    sizeof(type),
                    &type,
                    NULL );
                if( type == CL_COMMAND_NDRANGE_KERNEL )
                {
                    logf("Couldn't get MDAPI data for kernel!  clGetEventProfilingInfo returned '%s' (%08X)!\n",
                        enumName().name(errorCode).c_str(),
                        errorCode );
                }
            }

            delete [] pReport;
            pReport = NULL;
        }
    }
}